

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorReplaceCallback(gdImagePtr im,gdCallbackImageColor callback)

{
  int color;
  int iVar1;
  int *src;
  int *dst;
  int local_50;
  int local_4c;
  int len;
  int k;
  int *darr;
  int *sarr;
  int local_30;
  int y;
  int x;
  int n;
  int d;
  int c;
  gdCallbackImageColor callback_local;
  gdImagePtr im_local;
  
  y = 0;
  if (callback == (gdCallbackImageColor)0x0) {
    return 0;
  }
  if (im->trueColor == 0) {
    local_50 = 0;
    src = (int *)gdCalloc((long)im->colorsTotal,4);
    if (src == (int *)0x0) {
      return -1;
    }
    for (n = 0; n < im->colorsTotal; n = n + 1) {
      if (im->open[n] == 0) {
        src[local_50] = n;
        local_50 = local_50 + 1;
      }
    }
    dst = (int *)gdCalloc((long)local_50,4);
    if (dst == (int *)0x0) {
      gdFree(src);
      return -1;
    }
    for (local_4c = 0; local_4c < local_50; local_4c = local_4c + 1) {
      iVar1 = (*callback)(im,src[local_4c]);
      dst[local_4c] = iVar1;
    }
    y = gdImageColorReplaceArray(im,local_4c,src,dst);
    gdFree(dst);
    gdFree(src);
  }
  else {
    for (sarr._4_4_ = im->cy1; sarr._4_4_ <= im->cy2; sarr._4_4_ = sarr._4_4_ + 1) {
      for (local_30 = im->cx1; local_30 <= im->cx2; local_30 = local_30 + 1) {
        iVar1 = im->tpixels[sarr._4_4_][local_30];
        color = (*callback)(im,iVar1);
        if (color != iVar1) {
          gdImageSetPixel(im,local_30,sarr._4_4_,color);
          y = y + 1;
        }
      }
    }
  }
  return y;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceCallback (gdImagePtr im, gdCallbackImageColor callback)
{
	int c, d, n = 0;

	if (!callback) {
		return 0;
	}
	if (im->trueColor) {
		register int x, y;

		for (y = im->cy1; y <= im->cy2; y++) {
			for (x = im->cx1; x <= im->cx2; x++) {
				c = gdImageTrueColorPixel(im, x, y);
				if ( (d = callback(im, c)) != c) {
					gdImageSetPixel(im, x, y, d);
					n++;
				}
			}
		}
	} else { /* palette */
		int *sarr, *darr;
		int k, len = 0;

		sarr = (int *)gdCalloc(im->colorsTotal, sizeof(int));
		if (!sarr) {
			return -1;
		}
		for (c = 0; c < im->colorsTotal; c++) {
			if (!im->open[c]) {
				sarr[len++] = c;
			}
		}
		darr = (int *)gdCalloc(len, sizeof(int));
		if (!darr) {
			gdFree(sarr);
			return -1;
		}
		for (k = 0; k < len; k++) {
			darr[k] = callback(im, sarr[k]);
		}
		n = gdImageColorReplaceArray(im, k, sarr, darr);
		gdFree(darr);
		gdFree(sarr);
	}
	return n;
}